

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::subcase_start(XmlReporter *this,SubcaseSignature *in)

{
  XmlWriter *this_00;
  long in_RSI;
  XmlReporter *in_RDI;
  String *in_stack_000000b0;
  string *in_stack_000000b8;
  XmlWriter *in_stack_000000c0;
  lock_guard<std::mutex> lock;
  string *in_stack_fffffffffffffee8;
  allocator *paVar1;
  XmlWriter *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [8];
  char *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  XmlWriter *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"SubCase",&local_39);
  XmlWriter::startElement(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"name",&local_71);
  XmlWriter::writeAttribute<doctest::String>(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"filename",&local_99);
  skipPathFromFilename(in_stack_fffffffffffffef8);
  this_00 = XmlWriter::writeAttribute
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      );
  paVar1 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"line",paVar1);
  line(in_RDI,*(uint *)(local_10 + 0x20));
  XmlWriter::writeAttribute<unsigned_int>
            (in_stack_000000c0,in_stack_000000b8,(uint *)in_stack_000000b0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  XmlWriter::ensureTagClosed(this_00);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11e407);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("SubCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file))
                    .writeAttribute("line", line(in.m_line));
            xml.ensureTagClosed();
        }